

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O0

sds duckdb_hll::sdstrim(sds s,char *cset)

{
  size_t sVar1;
  char *pcVar2;
  char *in_RSI;
  sds in_RDI;
  bool bVar3;
  size_t len;
  char *ep;
  char *sp;
  char *end;
  char *start;
  char *local_50;
  char *local_30;
  char *local_28;
  
  sVar1 = sdslen(in_RDI);
  local_30 = in_RDI + (sVar1 - 1);
  local_28 = in_RDI;
  while( true ) {
    bVar3 = false;
    if (local_28 <= local_30) {
      pcVar2 = strchr(in_RSI,(int)*local_28);
      bVar3 = pcVar2 != (char *)0x0;
    }
    if (!bVar3) break;
    local_28 = local_28 + 1;
  }
  while( true ) {
    bVar3 = false;
    if (local_28 < local_30) {
      pcVar2 = strchr(in_RSI,(int)*local_30);
      bVar3 = pcVar2 != (char *)0x0;
    }
    if (!bVar3) break;
    local_30 = local_30 + -1;
  }
  if (local_30 < local_28) {
    local_50 = (char *)0x0;
  }
  else {
    local_50 = local_30 + (1 - (long)local_28);
  }
  if (in_RDI != local_28) {
    memmove(in_RDI,local_28,(size_t)local_50);
  }
  in_RDI[(long)local_50] = '\0';
  sdssetlen(in_RDI,(size_t)local_50);
  return in_RDI;
}

Assistant:

sds sdstrim(sds s, const char *cset) {
    char *start, *end, *sp, *ep;
    size_t len;

    sp = start = s;
    ep = end = s+sdslen(s)-1;
    while(sp <= end && strchr(cset, *sp)) sp++;
    while(ep > sp && strchr(cset, *ep)) ep--;
    len = (sp > ep) ? 0 : ((ep-sp)+1);
    if (s != sp) memmove(s, sp, len);
    s[len] = '\0';
    sdssetlen(s,len);
    return s;
}